

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__psd_is16(stbi__context *s)

{
  stbi__uint32 sVar1;
  int iVar2;
  stbi__context *in_RDI;
  int depth;
  int channelCount;
  int in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  sVar1 = stbi__get32be(in_RDI);
  if (sVar1 == 0x38425053) {
    iVar2 = stbi__get16be(in_RDI);
    if (iVar2 == 1) {
      stbi__skip(in_RDI,in_stack_ffffffffffffffec);
      iVar2 = stbi__get16be(in_RDI);
      if ((iVar2 < 0) || (0x10 < iVar2)) {
        stbi__rewind(in_RDI);
        local_4 = 0;
      }
      else {
        iVar2 = stbi__get16be(in_RDI);
        if (iVar2 == 0x10) {
          local_4 = 1;
        }
        else {
          stbi__rewind(in_RDI);
          local_4 = 0;
        }
      }
    }
    else {
      stbi__rewind(in_RDI);
      local_4 = 0;
    }
  }
  else {
    stbi__rewind(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int stbi__psd_is16(stbi__context *s)
{
   int channelCount, depth;
   if (stbi__get32be(s) != 0x38425053) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 1) {
       stbi__rewind( s );
       return 0;
   }
   stbi__skip(s, 6);
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16) {
       stbi__rewind( s );
       return 0;
   }
   STBI_NOTUSED(stbi__get32be(s));
   STBI_NOTUSED(stbi__get32be(s));
   depth = stbi__get16be(s);
   if (depth != 16) {
       stbi__rewind( s );
       return 0;
   }
   return 1;
}